

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddCollateType(Parse *pParse,Token *pToken)

{
  int iVar1;
  char *pcVar2;
  CollSeq *pCVar3;
  char *pcVar4;
  sqlite3 *in_RSI;
  undefined8 *in_RDI;
  Index *pIdx;
  sqlite3 *db;
  char *zColl;
  int i;
  Table *p;
  Token *in_stack_ffffffffffffffc8;
  sqlite3 *db_00;
  undefined4 in_stack_ffffffffffffffe0;
  Column *pCol;
  
  pCol = (Column *)in_RDI[0x2c];
  if ((pCol != (Column *)0x0) && (*(byte *)((long)in_RDI + 0x134) < 2)) {
    iVar1 = *(short *)((long)&pCol[3].zCnName + 6) + -1;
    db_00 = (sqlite3 *)*in_RDI;
    pcVar2 = sqlite3NameFromToken(db_00,in_stack_ffffffffffffffc8);
    if (pcVar2 != (char *)0x0) {
      pCVar3 = sqlite3LocateCollSeq((Parse *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),pcVar2);
      if (pCVar3 != (CollSeq *)0x0) {
        sqlite3ColumnSetColl(in_RSI,pCol,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
        for (pcVar2 = pCol[1].zCnName; pcVar2 != (char *)0x0; pcVar2 = *(char **)(pcVar2 + 0x28)) {
          if (**(short **)(pcVar2 + 8) == iVar1) {
            pcVar4 = sqlite3ColumnColl((Column *)(*(long *)&pCol->field_0x8 + (long)iVar1 * 0x10));
            **(undefined8 **)(pcVar2 + 0x40) = pcVar4;
          }
        }
        in_stack_ffffffffffffffc8 = (Token *)0x0;
      }
      sqlite3DbFree(db_00,in_stack_ffffffffffffffc8);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddCollateType(Parse *pParse, Token *pToken){
  Table *p;
  int i;
  char *zColl;              /* Dequoted name of collation sequence */
  sqlite3 *db;

  if( (p = pParse->pNewTable)==0 || IN_RENAME_OBJECT ) return;
  i = p->nCol-1;
  db = pParse->db;
  zColl = sqlite3NameFromToken(db, pToken);
  if( !zColl ) return;

  if( sqlite3LocateCollSeq(pParse, zColl) ){
    Index *pIdx;
    sqlite3ColumnSetColl(db, &p->aCol[i], zColl);

    /* If the column is declared as "<name> PRIMARY KEY COLLATE <type>",
    ** then an index may have been created on this column before the
    ** collation type was added. Correct this if it is the case.
    */
    for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->nKeyCol==1 );
      if( pIdx->aiColumn[0]==i ){
        pIdx->azColl[0] = sqlite3ColumnColl(&p->aCol[i]);
      }
    }
  }
  sqlite3DbFree(db, zColl);
}